

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings)

{
  HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*> *params;
  Array<kj::_::HashBucket> *pAVar1;
  size_t *psVar2;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  **ppRVar3;
  uint uVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  Entry *pEVar7;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  *pRVar8;
  Entry *pEVar9;
  uint uVar10;
  Entry *__dest;
  undefined8 uVar12;
  ulong uVar13;
  Scope *ptr;
  HashBucket *pHVar14;
  ulong capacity;
  long lVar15;
  long lVar16;
  size_t __n;
  Entry *__src;
  uint uVar17;
  size_t sVar18;
  size_t in_R8;
  HashBucket *pHVar19;
  Entry *pEVar20;
  ArrayPtr<const_unsigned_char> s;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  SchemaBindingsPair key;
  Array<kj::_::HashBucket> local_68;
  undefined8 *local_50;
  HashBucket local_48;
  RawSchema *local_40;
  Scope *local_38;
  HashBucket HVar11;
  
  ptr = bindings.ptr;
  if (bindings.size_ == 0) {
    HVar11 = (HashBucket)&schema->defaultBrand;
  }
  else {
    params = &this->brands;
    local_40 = schema;
    local_38 = ptr;
    kj::
    Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
    ::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
              ((Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
                *)&local_68,(SchemaBindingsPair *)params);
    if (local_68.ptr == (HashBucket *)0x0) {
      local_48 = (HashBucket)kj::Arena::allocateBytes(&this->arena,0x28,8,false);
      *(undefined8 *)local_48 = 0;
      *(Scope **)((long)local_48 + 8) = (Scope *)0x0;
      *(Dependency **)((long)local_48 + 0x10) = (Dependency *)0x0;
      *(undefined8 *)((long)local_48 + 0x18) = 0;
      *(Initializer **)((long)local_48 + 0x20) = (Initializer *)0x0;
      pEVar20 = (this->brands).table.rows.builder.ptr;
      lVar15 = (long)(this->brands).table.rows.builder.pos - (long)pEVar20 >> 3;
      lVar16 = lVar15 * -0x5555555555555555;
      pHVar14 = (HashBucket *)(this->brands).table.indexes.buckets.size_;
      if ((ulong)((long)pHVar14 * 2) < ((this->brands).table.indexes.erasedCount + lVar16) * 3 + 3)
      {
        pAVar1 = &(this->brands).table.indexes.buckets;
        oldBuckets.size_ = lVar15 + 3;
        oldBuckets.ptr = pHVar14;
        kj::_::rehash(&local_68,(_ *)pAVar1->ptr,oldBuckets,in_R8);
        pHVar14 = pAVar1->ptr;
        if (pHVar14 != (HashBucket *)0x0) {
          sVar5 = (this->brands).table.indexes.buckets.size_;
          pAVar1->ptr = (HashBucket *)0x0;
          (this->brands).table.indexes.buckets.size_ = 0;
          pAVar6 = (this->brands).table.indexes.buckets.disposer;
          (*(code *)**(undefined8 **)pAVar6)(pAVar6,pHVar14,8,sVar5,sVar5,0);
        }
        (this->brands).table.indexes.buckets.ptr = local_68.ptr;
        (this->brands).table.indexes.buckets.size_ = local_68.size_;
        (this->brands).table.indexes.buckets.disposer = local_68.disposer;
        (this->brands).table.indexes.erasedCount = 0;
      }
      uVar10 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,schema);
      local_68.ptr = (HashBucket *)CONCAT44(local_68.ptr._4_4_,uVar10);
      uVar10 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,ptr);
      local_68.ptr = (HashBucket *)CONCAT44(uVar10,local_68.ptr._0_4_);
      s.size_ = 8;
      s.ptr = (uchar *)&local_68;
      uVar10 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
      sVar5 = (this->brands).table.indexes.buckets.size_;
      uVar17 = (int)sVar5 - 1U & uVar10;
      pHVar14 = (HashBucket *)0x0;
      do {
        pHVar19 = (this->brands).table.indexes.buckets.ptr + uVar17;
        uVar4 = pHVar19->value;
        if (uVar4 == 1) {
          if (pHVar14 == (HashBucket *)0x0) {
            pHVar14 = pHVar19;
          }
        }
        else {
          if (uVar4 == 0) {
            if (pHVar14 != (HashBucket *)0x0) {
              psVar2 = &(this->brands).table.indexes.erasedCount;
              *psVar2 = *psVar2 - 1;
              pHVar19 = pHVar14;
            }
            *pHVar19 = (HashBucket)(((ulong)uVar10 | lVar16 << 0x20) + 0x200000000);
            pEVar20 = (this->brands).table.rows.builder.pos;
            if (pEVar20 == (this->brands).table.rows.builder.endPtr) {
              pEVar7 = (params->table).rows.builder.ptr;
              lVar15 = (long)pEVar20 - (long)pEVar7 >> 3;
              uVar13 = lVar15 * -0x5555555555555555;
              capacity = 4;
              if (pEVar20 != pEVar7) {
                capacity = lVar15 * 0x5555555555555556;
              }
              if (capacity <= uVar13 && uVar13 - capacity != 0) {
                (this->brands).table.rows.builder.pos = pEVar7 + capacity;
              }
              __dest = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                          (0x18,0,capacity,(_func_void_void_ptr *)0x0,
                                           (_func_void_void_ptr *)0x0);
              pEVar7 = __dest + capacity;
              local_50 = &kj::_::HeapArrayDisposer::instance;
              __src = (this->brands).table.rows.builder.ptr;
              __n = (long)(this->brands).table.rows.builder.pos - (long)__src;
              local_68.ptr = (HashBucket *)__dest;
              local_68.disposer = (ArrayDisposer *)pEVar7;
              if (__n != 0) {
                memcpy(__dest,__src,__n);
                __src = (params->table).rows.builder.ptr;
              }
              pEVar20 = (Entry *)((long)__dest + __n);
              if (__src != (Entry *)0x0) {
                pRVar8 = (this->brands).table.rows.builder.pos;
                pEVar9 = (this->brands).table.rows.builder.endPtr;
                (params->table).rows.builder.ptr = (Entry *)0x0;
                (this->brands).table.rows.builder.pos =
                     (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                      *)0x0;
                (this->brands).table.rows.builder.endPtr = (Entry *)0x0;
                pAVar6 = (this->brands).table.rows.builder.disposer;
                local_68.size_ = (size_t)pEVar20;
                (*(code *)**(undefined8 **)pAVar6)
                          (pAVar6,__src,0x18,((long)pRVar8 - (long)__src >> 3) * -0x5555555555555555
                           ,((long)pEVar9 - (long)__src >> 3) * -0x5555555555555555,0);
              }
              (this->brands).table.rows.builder.ptr = __dest;
              (this->brands).table.rows.builder.pos = pEVar20;
              (this->brands).table.rows.builder.endPtr = pEVar7;
              (this->brands).table.rows.builder.disposer =
                   (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
            }
            (pEVar20->key).schema = schema;
            (pEVar20->key).scopeBindings = ptr;
            pEVar20->value = (RawBrandedSchema *)local_48;
            ppRVar3 = &(this->brands).table.rows.builder.pos;
            *ppRVar3 = *ppRVar3 + 1;
            *(RawSchema **)local_48 = schema;
            *(Scope **)((long)local_48 + 8) = ptr;
            *(uint32_t *)((long)local_48 + 0x18) = (uint32_t)bindings.size_;
            *(BrandedInitializerImpl **)((long)local_48 + 0x20) = &this->brandedInitializer;
            uVar12._0_4_ = local_48.hash;
            uVar12._4_4_ = local_48.value;
            return (RawBrandedSchema *)uVar12;
          }
          if (((pHVar19->hash == uVar10) && (pEVar20[uVar4 - 2].key.schema == schema)) &&
             (pEVar20[uVar4 - 2].key.scopeBindings == ptr)) {
            kj::_::throwDuplicateTableRow();
          }
        }
        sVar18 = (ulong)uVar17 + 1;
        uVar17 = (uint)sVar18;
        if (sVar18 == sVar5) {
          uVar17 = 0;
        }
      } while( true );
    }
    HVar11 = local_68.ptr[2];
  }
  return (RawBrandedSchema *)HVar11;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, kj::ArrayPtr<const _::RawBrandedSchema::Scope> bindings) {
  if (bindings.size() == 0) {
    // `defaultBrand` is the version where all type parameters are bound to `AnyPointer`.
    return &schema->defaultBrand;
  }

  SchemaBindingsPair key { schema, bindings.begin() };
  KJ_IF_SOME(existing, brands.find(key)) {
    return existing;
  } else {
    auto& brand = arena.allocate<_::RawBrandedSchema>();
    memset(&brand, 0, sizeof(brand));
    brands.insert(key, &brand);

    brand.generic = schema;
    brand.scopes = bindings.begin();
    brand.scopeCount = bindings.size();
    brand.lazyInitializer = &brandedInitializer;
    return &brand;
  }